

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IndexAffinityOk(Expr *pExpr,char idx_affinity)

{
  char aff2;
  Expr *pExpr_00;
  bool bVar1;
  
  aff2 = sqlite3ExprAffinity(pExpr->pLeft);
  pExpr_00 = pExpr->pRight;
  if (pExpr_00 == (Expr *)0x0) {
    if ((pExpr->flags & 0x800) != 0) {
      pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
      goto LAB_0017190f;
    }
    if (aff2 != '\0') goto LAB_00171917;
  }
  else {
LAB_0017190f:
    aff2 = sqlite3CompareAffinity(pExpr_00,aff2);
LAB_00171917:
    if (aff2 != 'A') {
      if (aff2 == 'B') {
        bVar1 = idx_affinity == 'B';
      }
      else {
        bVar1 = 0x42 < (byte)idx_affinity;
      }
      goto LAB_00171935;
    }
  }
  bVar1 = true;
LAB_00171935:
  return (int)bVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexAffinityOk(Expr *pExpr, char idx_affinity){
  char aff = comparisonAffinity(pExpr);
  switch( aff ){
    case SQLITE_AFF_BLOB:
      return 1;
    case SQLITE_AFF_TEXT:
      return idx_affinity==SQLITE_AFF_TEXT;
    default:
      return sqlite3IsNumericAffinity(idx_affinity);
  }
}